

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O3

void __thiscall
slang::ast::Definition::ParameterDecl::ParameterDecl
          (ParameterDecl *this,Scope *scope,TypeParameterDeclarationSyntax *syntax,
          TypeAssignmentSyntax *decl,bool isLocal,bool isPort)

{
  SourceLocation location;
  DiagCode DVar1;
  DiagCode code;
  string_view sVar2;
  
  (this->field_0).typeSyntax = syntax;
  (this->field_1).typeDecl = decl;
  (this->name)._M_len = 0;
  (this->name)._M_str = (char *)0x0;
  this->location = (SourceLocation)0x0;
  this->isTypeParam = true;
  this->isLocalParam = isLocal;
  this->isPortParam = isPort;
  this->hasSyntax = true;
  sVar2 = parsing::Token::valueText(&decl->name);
  this->name = sVar2;
  location = parsing::Token::location(&decl->name);
  this->location = location;
  if ((!isPort || isLocal) && decl->assignment == (EqualsTypeClauseSyntax *)0x0) {
    DVar1.subsystem = Declarations;
    DVar1.code = 0x4e;
    code.subsystem = Declarations;
    code.code = 0xb;
    if (isPort) {
      code = DVar1;
    }
    Scope::addDiag(scope,code,location);
    return;
  }
  return;
}

Assistant:

Definition::ParameterDecl::ParameterDecl(const Scope& scope,
                                         const TypeParameterDeclarationSyntax& syntax,
                                         const TypeAssignmentSyntax& decl, bool isLocal,
                                         bool isPort) :
    typeSyntax(&syntax),
    typeDecl(&decl), isTypeParam(true), isLocalParam(isLocal), isPortParam(isPort),
    hasSyntax(true) {

    name = decl.name.valueText();
    location = decl.name.location();

    if (!decl.assignment) {
        if (!isPort)
            scope.addDiag(diag::BodyParamNoInitializer, location);
        else if (isLocal)
            scope.addDiag(diag::LocalParamNoInitializer, location);
    }
}